

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<MPL::ModelPackage> * __thiscall
pybind11::class_<MPL::ModelPackage>::def<bool(*)(std::__cxx11::string_const&)>
          (class_<MPL::ModelPackage> *this,char *name_,
          _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **f)

{
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *f_00;
  handle obj;
  cpp_function cf;
  handle local_58;
  cpp_function local_50;
  handle local_48;
  is_method local_40;
  name local_38;
  sibling local_30;
  
  f_00 = *f;
  obj.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_40.class_.m_ptr = (handle)(handle)obj.m_ptr;
  local_38.value = name_;
  none::none((none *)&local_48);
  getattr((pybind11 *)&local_58,obj,name_,local_48);
  local_30.value.m_ptr = (handle)(handle)local_58.m_ptr;
  cpp_function::
  cpp_function<bool,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_50,f_00,&local_38,&local_40,&local_30);
  object::~object((object *)&local_58);
  object::~object((object *)&local_48);
  detail::add_class_method((object *)this,name_,&local_50);
  object::~object((object *)&local_50);
  return this;
}

Assistant:

class_ &def(const char *name_, Func &&f, const Extra &...extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)),
                        name(name_),
                        is_method(*this),
                        sibling(getattr(*this, name_, none())),
                        extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }